

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

Expression * __thiscall wasm::Debug::AddrExprMap::getEnd(AddrExprMap *this,BinaryLocation addr)

{
  const_iterator cVar1;
  Expression *pEVar2;
  BinaryLocation local_c [2];
  BinaryLocation addr_local;
  
  local_c[0] = addr;
  cVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->endMap)._M_h,local_c);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    pEVar2 = (Expression *)0x0;
  }
  else {
    pEVar2 = *(Expression **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                     ._M_cur + 0x10);
  }
  return pEVar2;
}

Assistant:

Expression* getEnd(BinaryLocation addr) const {
    auto iter = endMap.find(addr);
    if (iter != endMap.end()) {
      return iter->second;
    }
    return nullptr;
  }